

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::PrimitiveTypeHelper<5>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = *ptr;
  if ((output->impl_).end_ <= output->cur_) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar5;
  }
  pbVar3 = output->cur_;
  if (uVar1 < 0x80) {
    *pbVar3 = (byte)uVar1;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = (byte)uVar1 | 0x80;
    if (uVar1 < 0x4000) {
      pbVar3[1] = (byte)((ulong)(long)(int)uVar1 >> 7);
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      uVar6 = (ulong)(long)(int)uVar1 >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
      *pbVar4 = (byte)uVar7;
    }
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt32NoTag(Get<int32>(ptr), output);
  }